

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::
     read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
               (_func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,FILE **fout,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp)

{
  size_t sVar1;
  float fVar2;
  float impacted_exposure;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float local_b8;
  OASIS_FLOAT local_b4;
  sampleslevelRec sr;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  float local_68;
  float fStack_64;
  int summary_set;
  summarySampleslevelHeader sh;
  
  summary_set = 0;
  sVar1 = fread(&summary_set,4,1,_stdin);
  vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001033e5:
  do {
    if (sVar1 == 0) {
      std::_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~_Vector_base
                (&vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>);
      return;
    }
    sVar1 = fread(&sh,0xc,1,_stdin);
    local_68 = 0.0;
    fStack_64 = 0.0;
    local_b4 = 0.0;
    local_b8 = 0.0;
    while (sVar1 != 0) {
      sVar1 = fread(&sr,8,1,_stdin);
      if (sr.sidx != -4) {
        if ((sVar1 == 0) || (sr.sidx == 0)) {
          dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&sh,&vrec,OutputData,outFile,m_occ,vp,local_b8,local_68,fStack_64,local_b4);
          outputrows_qplt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&sh,&vrec,fout[2],m_occ,vp);
          if (vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
              super__Vector_impl_data._M_start) {
            vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          goto LAB_001033e5;
        }
        impacted_exposure = 0.0;
        if (-2 < sr.sidx) {
          impacted_exposure = (float)(-(uint)(0.0 < sr.loss) & 0x3f800000) * sh.expval;
          outputrows_splt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&sh,&sr,fout[1],m_occ,vp,impacted_exposure);
        }
        if (sr.sidx == -1) {
          domeanout<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&sh,sr.loss,OutputData,outFile,m_occ,vp,0.0,local_b4);
        }
        else if (sr.sidx == -5) {
          local_b4 = sr.loss;
        }
        else {
          std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::push_back(&vrec,&sr);
          fVar2 = (float)samplesize_;
          fVar3 = impacted_exposure;
          if (impacted_exposure <= local_b8) {
            fVar3 = local_b8;
          }
          auVar4._0_8_ = CONCAT44(-(uint)(0.0 < sr.loss),impacted_exposure) & 0x3f800000ffffffff;
          auVar4._8_8_ = 0;
          auVar5._4_4_ = fVar2;
          auVar5._0_4_ = fVar2;
          auVar5._8_4_ = fVar2;
          auVar5._12_4_ = fVar2;
          auVar5 = divps(auVar4,auVar5);
          local_68 = local_68 + auVar5._0_4_;
          fStack_64 = fStack_64 + auVar5._4_4_;
          local_b8 = fVar3;
        }
      }
    }
    sVar1 = 0;
  } while( true );
}

Assistant:

inline void read_input(void (*OutputData)(const T&, const int, FILE*),
			       FILE * outFile, FILE ** fout,
			       moccT &m_occ, periodT &vp)
	{
		int summary_set = 0;
		size_t i = fread(&summary_set, sizeof(summary_set), 1, stdin);
		std::vector<sampleslevelRec> vrec;
		summarySampleslevelHeader sh;
		while (i != 0) {
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			OASIS_FLOAT max_loss = 0;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0) {
				OASIS_FLOAT impacted_exposure = 0;
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (sr.sidx == number_of_affected_risk_idx) continue;
				if (i == 0 || sr.sidx == 0) {
					dopltcalc(sh, vrec, OutputData, outFile,
						  m_occ, vp,
						  max_impacted_exposure,
						  mean_impacted_exposure,
						  chance_of_loss, max_loss);
					outputrows_qplt(sh, vrec, fout[QPLT],
							m_occ, vp);
					vrec.clear();
					break;
				} else if (sr.sidx >= -1) {
					impacted_exposure = sh.expval * (sr.loss > 0);
					outputrows_splt(sh, sr, fout[SPLT],
							m_occ, vp,
							impacted_exposure);
				}

				if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				} else if (sr.sidx == mean_idx) {
					domeanout(sh, sr.loss, OutputData,
						  outFile, m_occ, vp, 0.0,
						  max_loss);
				} else {
					vrec.push_back(sr);
					mean_impacted_exposure += impacted_exposure / samplesize_;
					if (impacted_exposure > max_impacted_exposure) {
						max_impacted_exposure = impacted_exposure;
					}
					chance_of_loss += (sr.loss > 0) / (OASIS_FLOAT)samplesize_;   // Relative frequency
				}
			}
		}
	}